

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateCodingSynapse.cpp
# Opt level: O2

void __thiscall
RateCodingSynapse::RateCodingSynapse(RateCodingSynapse *this,Population *n_from,Population *n_to)

{
  RateCodingSynapse_param *pRVar1;
  
  (this->super_Synapse)._vptr_Synapse = (_func_int **)&PTR_update_00134d60;
  pRVar1 = (RateCodingSynapse_param *)operator_new(8);
  pRVar1->time_window = 1.0;
  this->param = pRVar1;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spikes).
  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->singleOutput = false;
  initialize(this,n_from,n_to);
  return;
}

Assistant:

RateCodingSynapse::RateCodingSynapse(Population* n_from, Population* n_to) : 
    param(new RateCodingSynapse_param)
{
    initialize(n_from, n_to);
}